

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O2

void __thiscall HyperGraph::build_n_RRsets(HyperGraph *this,size_t numSamples)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  size_t i;
  ulong hyperIdx;
  
  hyperIdx = this->__numRRsets;
  sVar2 = numSamples;
  if (numSamples < hyperIdx) {
    sVar2 = hyperIdx;
  }
  this->__numRRsets = sVar2;
  for (; hyperIdx < numSamples; hyperIdx = hyperIdx + 1) {
    uVar1 = this->__numV;
    if (0x17d < dsfmt_global_data.idx) {
      dsfmt_gen_rand_all(&dsfmt_global_data);
      dsfmt_global_data.idx = 0;
    }
    lVar3 = (long)dsfmt_global_data.idx;
    dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
    build_one_RRset(this,*(uint *)((long)dsfmt_global_data.status + lVar3 * 8) % uVar1,hyperIdx);
  }
  return;
}

Assistant:

void build_n_RRsets(const size_t numSamples)
    {
        if (numSamples > SIZE_MAX)
        {
            std::cout << "Error:R too large" << std::endl;
            exit(1);
        }
        const auto prevSize = __numRRsets;
        __numRRsets = __numRRsets > numSamples ? __numRRsets : numSamples;
        for (auto i = prevSize; i < numSamples; i++)
        {
            build_one_RRset(dsfmt_gv_genrand_uint32_range(__numV), i);
        }
    }